

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O1

WebPDemuxer * WebPDemuxInternal(WebPData *data,int allow_partial,WebPDemuxState *state,int version)

{
  int *data_00;
  bool bVar1;
  VP8StatusCode VVar2;
  ParseStatus PVar3;
  int iVar4;
  WebPDemuxer *pWVar5;
  Frame *ptr;
  code *pcVar6;
  char cVar7;
  uint uVar8;
  size_t sVar9;
  ulong uVar10;
  ChunkParser *pCVar11;
  ulong data_size;
  WebPBitstreamFeatures local_58;
  
  if (state != (WebPDemuxState *)0x0) {
    *state = WEBP_DEMUX_PARSE_ERROR;
  }
  if (data == (WebPData *)0x0 || (version & 0xffffff00U) != 0x100) {
    return (WebPDemuxer *)0x0;
  }
  data_00 = (int *)data->bytes;
  if (data_00 == (int *)0x0) {
    return (WebPDemuxer *)0x0;
  }
  data_size = data->size;
  if (data_size == 0) {
    return (WebPDemuxer *)0x0;
  }
  if (data_size < 0x14) {
    cVar7 = '\x01';
LAB_00104e51:
    sVar9 = 0;
    uVar10 = 0;
  }
  else {
    cVar7 = '\x02';
    if (((*data_00 != 0x46464952) || (data_00[2] != 0x50424557)) || (data_00[1] + 9U < 0x11))
    goto LAB_00104e51;
    uVar10 = (ulong)(data_00[1] + 8);
    if (uVar10 <= data_size) {
      data_size = uVar10;
    }
    sVar9 = 0xc;
    cVar7 = '\0';
  }
  if (cVar7 == '\0') {
    if ((allow_partial == 0) && (data_size < uVar10)) {
      return (WebPDemuxer *)0x0;
    }
    pWVar5 = (WebPDemuxer *)WebPSafeCalloc(1,0x68);
    if (pWVar5 == (WebPDemuxer *)0x0) {
      return (WebPDemuxer *)0x0;
    }
    pWVar5->state = WEBP_DEMUX_PARSING_HEADER;
    pWVar5->canvas_width = -1;
    pWVar5->canvas_height = -1;
    pWVar5->loop_count = 1;
    pWVar5->bgcolor = 0xffffffff;
    pWVar5->frames_tail = &pWVar5->frames;
    pWVar5->chunks_tail = &pWVar5->chunks;
    (pWVar5->mem).start = sVar9;
    (pWVar5->mem).end = data_size;
    (pWVar5->mem).riff_end = uVar10;
    (pWVar5->mem).buf_size = data_size;
    (pWVar5->mem).buf = (uint8_t *)data_00;
    if (*(int *)((long)data_00 + sVar9) == 0x20385056) {
      pCVar11 = kMasterChunks;
      pcVar6 = ParseSingleImage;
    }
    else {
      pCVar11 = kMasterChunks;
      do {
        pCVar11 = pCVar11 + 1;
        pcVar6 = pCVar11->parse;
        if (pcVar6 == (_func_ParseStatus_WebPDemuxer_ptr *)0x0) goto LAB_001050f7;
      } while (*(int *)pCVar11->id != *(int *)((long)data_00 + sVar9));
    }
    PVar3 = (*pcVar6)(pWVar5);
    if (PVar3 == PARSE_OK) {
      pWVar5->state = WEBP_DEMUX_DONE;
    }
    if (((PVar3 == PARSE_ERROR) || (PVar3 == PARSE_NEED_MORE_DATA && uVar10 <= data_size)) ||
       (iVar4 = (*pCVar11->valid)(pWVar5), iVar4 == 0)) {
      pWVar5->state = WEBP_DEMUX_PARSE_ERROR;
LAB_001050f7:
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    if (state != (WebPDemuxState *)0x0) {
      *state = pWVar5->state;
    }
    if (bVar1) {
      WebPDemuxDelete(pWVar5);
      return (WebPDemuxer *)0x0;
    }
    return pWVar5;
  }
  if (cVar7 != '\x02') goto LAB_00104f80;
  VVar2 = WebPGetFeaturesInternal((uint8_t *)data_00,data_size,&local_58,0x210);
  if (VVar2 == VP8_STATUS_OK) {
    pWVar5 = (WebPDemuxer *)WebPSafeCalloc(1,0x68);
    ptr = (Frame *)WebPSafeCalloc(1,0x50);
    if (ptr == (Frame *)0x0 || pWVar5 == (WebPDemuxer *)0x0) {
LAB_00104f64:
      WebPSafeFree(pWVar5);
      WebPSafeFree(ptr);
      cVar7 = '\x02';
      goto LAB_00104f79;
    }
    pWVar5->state = WEBP_DEMUX_PARSING_HEADER;
    pWVar5->canvas_width = -1;
    pWVar5->canvas_height = -1;
    pWVar5->loop_count = 1;
    pWVar5->bgcolor = 0xffffffff;
    pWVar5->frames_tail = &pWVar5->frames;
    pWVar5->chunks_tail = &pWVar5->chunks;
    (pWVar5->mem).start = sVar9;
    (pWVar5->mem).end = data_size;
    (pWVar5->mem).riff_end = uVar10;
    (pWVar5->mem).buf_size = data_size;
    (pWVar5->mem).buf = (uint8_t *)data_00;
    ptr->img_components[0].offset = 0;
    ptr->img_components[0].size = data_size;
    ptr->width = local_58.width;
    ptr->height = local_58.height;
    uVar8 = ptr->has_alpha | local_58.has_alpha;
    ptr->has_alpha = uVar8;
    ptr->frame_num = 1;
    ptr->complete = 1;
    if ((pWVar5->frames != (Frame *)0x0) && (pWVar5->frames->complete == 0)) goto LAB_00104f64;
    pWVar5->frames = ptr;
    ptr->next = (Frame *)0x0;
    pWVar5->frames_tail = &ptr->next;
    pWVar5->state = WEBP_DEMUX_DONE;
    pWVar5->canvas_width = local_58.width;
    pWVar5->canvas_height = local_58.height;
    pWVar5->feature_flags = pWVar5->feature_flags | (uint)(uVar8 != 0) << 4;
    pWVar5->num_frames = 1;
    cVar7 = '\0';
  }
  else {
    cVar7 = (VVar2 != VP8_STATUS_NOT_ENOUGH_DATA) + '\x01';
LAB_00104f79:
    pWVar5 = (WebPDemuxer *)0x0;
  }
  if (cVar7 == '\0') {
    if (state != (WebPDemuxState *)0x0) {
      *state = WEBP_DEMUX_DONE;
      return pWVar5;
    }
    return pWVar5;
  }
LAB_00104f80:
  if (state != (WebPDemuxState *)0x0) {
    *state = -(uint)(cVar7 != '\x01');
  }
  return (WebPDemuxer *)0x0;
}

Assistant:

WebPDemuxer* WebPDemuxInternal(const WebPData* data, int allow_partial,
                               WebPDemuxState* state, int version) {
  const ChunkParser* parser;
  int partial;
  ParseStatus status = PARSE_ERROR;
  MemBuffer mem;
  WebPDemuxer* dmux;

  if (state != NULL) *state = WEBP_DEMUX_PARSE_ERROR;

  if (WEBP_ABI_IS_INCOMPATIBLE(version, WEBP_DEMUX_ABI_VERSION)) return NULL;
  if (data == NULL || data->bytes == NULL || data->size == 0) return NULL;

  if (!InitMemBuffer(&mem, data->bytes, data->size)) return NULL;
  status = ReadHeader(&mem);
  if (status != PARSE_OK) {
    // If parsing of the webp file header fails attempt to handle a raw
    // VP8/VP8L frame. Note 'allow_partial' is ignored in this case.
    if (status == PARSE_ERROR) {
      status = CreateRawImageDemuxer(&mem, &dmux);
      if (status == PARSE_OK) {
        if (state != NULL) *state = WEBP_DEMUX_DONE;
        return dmux;
      }
    }
    if (state != NULL) {
      *state = (status == PARSE_NEED_MORE_DATA) ? WEBP_DEMUX_PARSING_HEADER
                                                : WEBP_DEMUX_PARSE_ERROR;
    }
    return NULL;
  }

  partial = (mem.buf_size < mem.riff_end);
  if (!allow_partial && partial) return NULL;

  dmux = (WebPDemuxer*)WebPSafeCalloc(1ULL, sizeof(*dmux));
  if (dmux == NULL) return NULL;
  InitDemux(dmux, &mem);

  status = PARSE_ERROR;
  for (parser = kMasterChunks; parser->parse != NULL; ++parser) {
    if (!memcmp(parser->id, GetBuffer(&dmux->mem), TAG_SIZE)) {
      status = parser->parse(dmux);
      if (status == PARSE_OK) dmux->state = WEBP_DEMUX_DONE;
      if (status == PARSE_NEED_MORE_DATA && !partial) status = PARSE_ERROR;
      if (status != PARSE_ERROR && !parser->valid(dmux)) status = PARSE_ERROR;
      if (status == PARSE_ERROR) dmux->state = WEBP_DEMUX_PARSE_ERROR;
      break;
    }
  }
  if (state != NULL) *state = dmux->state;

  if (status == PARSE_ERROR) {
    WebPDemuxDelete(dmux);
    return NULL;
  }
  return dmux;
}